

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

int tunnel_recv_callback
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *mem,size_t len,
              void *userp)

{
  ssize_t sVar1;
  CURLcode local_54 [2];
  CURLcode result;
  ssize_t nwritten;
  cf_h2_proxy_ctx *ctx;
  Curl_cfilter *cf;
  void *userp_local;
  size_t len_local;
  uint8_t *mem_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  nwritten = *(long *)((long)userp + 0x10);
  if (stream_id == *(int *)(nwritten + 0x120)) {
    ctx = (cf_h2_proxy_ctx *)userp;
    cf = (Curl_cfilter *)userp;
    userp_local = (void *)len;
    len_local = (size_t)mem;
    mem_local._0_4_ = stream_id;
    mem_local._7_1_ = flags;
    _stream_id_local = session;
    sVar1 = Curl_bufq_write((bufq *)(nwritten + 0x98),mem,len,local_54);
    if ((sVar1 < 0) && (local_54[0] != CURLE_AGAIN)) {
      session_local._4_4_ = -0x386;
    }
    else {
      session_local._4_4_ = 0;
    }
  }
  else {
    session_local._4_4_ = -0x386;
  }
  return session_local._4_4_;
}

Assistant:

static int tunnel_recv_callback(nghttp2_session *session, uint8_t flags,
                                int32_t stream_id,
                                const uint8_t *mem, size_t len, void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  ssize_t nwritten;
  CURLcode result;

  (void)flags;
  (void)session;
  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */

  if(stream_id != ctx->tunnel.stream_id)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  nwritten = Curl_bufq_write(&ctx->tunnel.recvbuf, mem, len, &result);
  if(nwritten < 0) {
    if(result != CURLE_AGAIN)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    nwritten = 0;
  }
  DEBUGASSERT((size_t)nwritten == len);
  return 0;
}